

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_otherTypeCopyAssignmentEmptyForEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
::TestBody(optTyped_otherTypeCopyAssignmentEmptyForEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
           *this)

{
  bool bVar1;
  value_type_conflict2 *lhs;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  other_opt_type o1;
  AssertHelper local_60;
  AssertHelper local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  string local_48;
  AssertHelper local_28;
  opt<float,_mp::opt_null_type_policy<float,_(anonymous_namespace)::null_floating<float>_>_>
  local_1c;
  opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>
  local_18;
  
  local_1c.storage_ = 0.0;
  local_18.storage_ = 0.0;
  local_48._M_dataplus._M_p._0_1_ = 1;
  local_48._M_string_length = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48._M_dataplus._M_p._0_1_ = '\x01';
  local_48._M_string_length = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<float,_mp::opt_null_type_policy<float,_(anonymous_namespace)::null_floating<float>_>_>::
    value(&local_1c);
  }
  testing::Message::Message((Message *)&local_48);
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x28f,
             "Expected: o1.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if (CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p
                                    ) + 8))();
    }
  }
  lhs = &(this->
         super_optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
         ).value_2;
  local_58.data_._0_4_ =
       ~-(uint)(local_1c.storage_ != 0.0) &
       (uint)(this->
             super_optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
             ).other_value_2 | (uint)local_1c.storage_ & -(uint)(local_1c.storage_ != 0.0);
  testing::internal::CmpHelperEQ<double,float>
            ((internal *)&local_48,"this->value_2","o1.value_or(this->other_value_2)",lhs,
             (float *)&local_58);
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_48._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x290,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58.data_._0_1_ = (internal)(local_18.storage_ == 0.0);
  if ((local_18.storage_ != 0.0) || (NAN(local_18.storage_))) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&local_58,(AssertionResult *)0x1b9f12,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x291,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                      (char)local_48._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
        &local_48.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p),
                      local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.data_._0_1_ = (internal)(local_18.storage_ == 0.0);
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_18.storage_ != 0.0) || (NAN(local_18.storage_))) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&local_58,(AssertionResult *)"o2.has_value()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x292,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                      (char)local_48._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
        &local_48.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p),
                      local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::
    opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>::
    value(&local_18);
  }
  testing::Message::Message((Message *)&local_48);
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x293,
             "Expected: o2.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if (CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p
                                    ) + 8))();
    }
  }
  local_58.data_ =
       (AssertHelperData *)
       (~-(ulong)(local_18.storage_ != 0.0) & (ulong)*lhs |
       (ulong)local_18.storage_ & -(ulong)(local_18.storage_ != 0.0));
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_48,"this->value_2","o2.value_or(this->value_2)",lhs,
             (double *)&local_58);
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_48._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x294,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TYPED_TEST(optTyped, otherTypeCopyAssignmentEmptyForEmpty)
{
  using opt_type = typename TestFixture::type;
  using other_opt_type = opt<typename TestFixture::traits::other_type, typename TestFixture::traits::other_policy_type>;
  other_opt_type o1;
  opt_type o2;
  o2 = o1;
  EXPECT_FALSE(o1);
  EXPECT_FALSE(o1.has_value());
  EXPECT_THROW(o1.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o1.value_or(this->other_value_2));
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}